

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlChar * xmlSchemaCollapseString(xmlChar *value)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int local_3c;
  xmlChar *pxStack_38;
  int col;
  xmlChar *g;
  xmlChar *f;
  xmlChar *end;
  xmlChar *start;
  xmlChar *value_local;
  
  local_3c = 0;
  end = value;
  if (value == (xmlChar *)0x0) {
    value_local = (xmlChar *)0x0;
  }
  else {
    while( true ) {
      bVar4 = false;
      if (((*end != '\0') && (bVar4 = true, *end != ' ')) &&
         ((*end < 9 || (bVar4 = true, 10 < *end)))) {
        bVar4 = *end == '\r';
      }
      if (!bVar4) break;
      end = end + 1;
    }
    for (f = end; pxVar3 = f, iVar1 = (int)end, *f != '\0'; f = f + 1) {
      if ((*f == ' ') && ((f[1] == ' ' || (((8 < f[1] && (f[1] < 0xb)) || (f[1] == '\r')))))) {
        local_3c = (int)f - iVar1;
        break;
      }
      if (((*f == '\n') || (*f == '\t')) || (*f == '\r')) {
        local_3c = (int)f - iVar1;
        break;
      }
    }
    if (local_3c == 0) {
      do {
        pxVar2 = f;
        f = pxVar2 + -1;
        bVar4 = false;
        if (((end < f) && (bVar4 = true, *f != ' ')) && ((*f < 9 || (bVar4 = true, 10 < *f)))) {
          bVar4 = *f == '\r';
        }
      } while (bVar4);
      if ((end == value) && (pxVar3 == pxVar2)) {
        value_local = (xmlChar *)0x0;
      }
      else {
        value_local = xmlStrndup(end,(int)pxVar2 - iVar1);
      }
    }
    else {
      value_local = xmlStrdup(end);
      if (value_local == (xmlChar *)0x0) {
        value_local = (xmlChar *)0x0;
      }
      else {
        pxStack_38 = value_local + local_3c;
        f = value_local + local_3c;
        while (*f != '\0') {
          if (((*f == ' ') || ((8 < *f && (*f < 0xb)))) || (*f == '\r')) {
            do {
              f = f + 1;
              bVar4 = true;
              if ((*f != ' ') && ((*f < 9 || (bVar4 = true, 10 < *f)))) {
                bVar4 = *f == '\r';
              }
            } while (bVar4);
            if (*f != '\0') {
              *pxStack_38 = ' ';
              pxStack_38 = pxStack_38 + 1;
            }
          }
          else {
            *pxStack_38 = *f;
            pxStack_38 = pxStack_38 + 1;
            f = f + 1;
          }
        }
        *pxStack_38 = '\0';
      }
    }
  }
  return value_local;
}

Assistant:

xmlChar *
xmlSchemaCollapseString(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;
    xmlChar *g;
    int col = 0;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) {
	if ((*end == ' ') && (IS_BLANK_CH(end[1]))) {
	    col = end - start;
	    break;
	} else if ((*end == 0xa) || (*end == 0x9) || (*end == 0xd)) {
	    col = end - start;
	    break;
	}
	end++;
    }
    if (col == 0) {
	f = end;
	end--;
	while ((end > start) && (IS_BLANK_CH(*end))) end--;
	end++;
	if ((start == value) && (f == end)) return(NULL);
	return(xmlStrndup(start, end - start));
    }
    start = xmlStrdup(start);
    if (start == NULL) return(NULL);
    g = (xmlChar *) (start + col);
    end = g;
    while (*end != 0) {
	if (IS_BLANK_CH(*end)) {
	    end++;
	    while (IS_BLANK_CH(*end)) end++;
	    if (*end != 0)
		*g++ = ' ';
	} else
	    *g++ = *end++;
    }
    *g = 0;
    return((xmlChar *) start);
}